

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

uint64_t pmevtyper_readfn(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  uint64_t uVar1;
  uint8_t counter;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  uVar1 = pmevtyper_read(env,ri,(ri->crm & 3) << 3 | ri->opc2 & 7);
  return uVar1;
}

Assistant:

static uint64_t pmevtyper_readfn(CPUARMState *env, const ARMCPRegInfo *ri)
{
    uint8_t counter = ((ri->crm & 3) << 3) | (ri->opc2 & 7);
    return pmevtyper_read(env, ri, counter);
}